

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O0

uint32_t hash_camera(scene_node *node)

{
  uint32_t uVar1;
  scene_node *node_local;
  
  uVar1 = hash_init();
  uVar1 = hash_ptr(uVar1,node);
  return uVar1;
}

Assistant:

static uint32_t hash_camera(const struct scene_node* node) {
    return hash_ptr(hash_init(), node);
}